

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall
RegisterDyndepParserTestUnsupportedVersion1_1::RegisterDyndepParserTestUnsupportedVersion1_1
          (RegisterDyndepParserTestUnsupportedVersion1_1 *this)

{
  RegisterDyndepParserTestUnsupportedVersion1_1 *this_local;
  
  RegisterTest(DyndepParserTestUnsupportedVersion1_1::Create,
               "DyndepParserTest.UnsupportedVersion1_1");
  return;
}

Assistant:

TEST_F(DyndepParserTest, UnsupportedVersion1_1) {
  const char kInput[] =
"ninja_dyndep_version = 1.1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unsupported 'ninja_dyndep_version = 1.1'\n"
            "ninja_dyndep_version = 1.1\n"
            "                          ^ near here", err);
}